

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_INDEX_ir(DisasContext_conflict1 *s,arg_INDEX_ir *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 start_00;
  TCGv_i64 incr_00;
  TCGv_i64 incr;
  TCGv_i64 start;
  TCGContext_conflict1 *tcg_ctx;
  arg_INDEX_ir *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    start_00 = tcg_const_i64_aarch64(tcg_ctx_00,(long)a->imm);
    incr_00 = cpu_reg_aarch64(s,a->rm);
    do_index(s,a->esz,a->rd,start_00,incr_00);
    tcg_temp_free_i64(tcg_ctx_00,start_00);
  }
  return true;
}

Assistant:

static bool trans_INDEX_ir(DisasContext *s, arg_INDEX_ir *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 start = tcg_const_i64(tcg_ctx, a->imm);
        TCGv_i64 incr = cpu_reg(s, a->rm);
        do_index(s, a->esz, a->rd, start, incr);
        tcg_temp_free_i64(tcg_ctx, start);
    }
    return true;
}